

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall spectest::JSONParser::ParseConst(JSONParser *this,TypedValue *out_value)

{
  Result RVar1;
  ExpectedValue expected;
  ExpectedValue EStack_38;
  
  EStack_38.value.value.field_0.i64_ = 0;
  EStack_38.value.value.field_0._8_8_ = 0;
  RVar1 = ParseExpectedValue(this,&EStack_38,No);
  if (RVar1.enum_ != Error) {
    *(undefined8 *)((long)&(out_value->value).field_0 + 8) = EStack_38.value.value.field_0._8_8_;
    out_value->type = EStack_38.value.type;
    (out_value->value).field_0.i64_ = EStack_38.value.value.field_0.i64_;
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

wabt::Result JSONParser::ParseConst(TypedValue* out_value) {
  ExpectedValue expected;
  CHECK_RESULT(ParseExpectedValue(&expected, AllowExpected::No));
  *out_value = expected.value;
  return wabt::Result::Ok;
}